

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

_Bool process_pref_file_layered
                (char *name,_Bool quiet,_Bool user,char *base_search_path,char *fallback_search_path
                ,_Bool *used_fallback)

{
  _Bool _Var1;
  char local_438 [8];
  char buf [1024];
  _Bool *used_fallback_local;
  char *fallback_search_path_local;
  char *base_search_path_local;
  _Bool user_local;
  _Bool quiet_local;
  char *name_local;
  
  if (base_search_path == (char *)0x0) {
    __assert_fail("base_search_path != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                  ,0x4f1,
                  "_Bool process_pref_file_layered(const char *, _Bool, _Bool, const char *, const char *, _Bool *)"
                 );
  }
  path_build(local_438,0x400,base_search_path,name);
  if (used_fallback != (_Bool *)0x0) {
    *used_fallback = false;
  }
  _Var1 = file_exists(local_438);
  if (((!_Var1) && (fallback_search_path != (char *)0x0)) &&
     (path_build(local_438,0x400,fallback_search_path,name), used_fallback != (_Bool *)0x0)) {
    *used_fallback = true;
  }
  _Var1 = process_pref_file_named(local_438,quiet,user);
  return _Var1;
}

Assistant:

static bool process_pref_file_layered(const char *name, bool quiet, bool user,
									  const char *base_search_path,
									  const char *fallback_search_path,
									  bool *used_fallback)
{
	char buf[1024];

	assert(base_search_path != NULL);

	/* Build the filename */
	path_build(buf, sizeof(buf), base_search_path, name);

	if (used_fallback != NULL)
		*used_fallback = false;

	if (!file_exists(buf) && fallback_search_path != NULL) {
		path_build(buf, sizeof(buf), fallback_search_path, name);

		if (used_fallback != NULL)
			*used_fallback = true;
	}

	return process_pref_file_named(buf, quiet, user);
}